

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

char * OPENSSL_strndup(char *str,size_t size)

{
  size_t n;
  char *ret;
  size_t alloc_size;
  size_t size_local;
  char *str_local;
  
  n = OPENSSL_strnlen(str,size);
  if (n + 1 < n) {
    ERR_put_error(0xe,0,0x41,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem.cc"
                  ,0x20b);
    str_local = (char *)0x0;
  }
  else {
    str_local = (char *)OPENSSL_malloc(n + 1);
    if (str_local == (char *)0x0) {
      str_local = (char *)0x0;
    }
    else {
      OPENSSL_memcpy(str_local,str,n);
      str_local[n] = '\0';
    }
  }
  return str_local;
}

Assistant:

char *OPENSSL_strndup(const char *str, size_t size) {
  size = OPENSSL_strnlen(str, size);

  size_t alloc_size = size + 1;
  if (alloc_size < size) {
    // overflow
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_MALLOC_FAILURE);
    return NULL;
  }
  char *ret = reinterpret_cast<char *>(OPENSSL_malloc(alloc_size));
  if (ret == NULL) {
    return NULL;
  }

  OPENSSL_memcpy(ret, str, size);
  ret[size] = '\0';
  return ret;
}